

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer>
             *this,back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  size_t *psVar1;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer>
  pVar2;
  list<char,_std::allocator<char>_> *plVar3;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar4;
  _List_node_base *p_Var5;
  long lVar6;
  
  if (*(long *)(this + 0x10) != 0) {
    bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                      (*(char **)(this + 8),*(char **)(this + 8) + *(long *)(this + 0x10),
                       (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)
                       it->container);
    it->container = (list<char,_std::allocator<char>_> *)bVar4;
  }
  plVar3 = it->container;
  lVar6 = *(long *)(this + 0x20);
  if (lVar6 != 0) {
    pVar2 = this[0x18];
    do {
      p_Var5 = (_List_node_base *)operator_new(0x18);
      *(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer>
        *)&p_Var5[1]._M_next = pVar2;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(plVar3->super__List_base<char,_std::allocator<char>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  it->container = plVar3;
  int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }